

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int var_plus_const(gen_ctx_t gen_ctx,ssa_edge_t_conflict se,bb_t_conflict from_bb,
                  MIR_op_t **var_op_ref,int64_t *c)

{
  MIR_op_t *pMVar1;
  bb_insn_t_conflict bb_insn;
  int iVar2;
  int iVar3;
  char *pcVar4;
  MIR_insn_t pMVar5;
  
  if (se == (ssa_edge_t_conflict)0x0) {
    return 0;
  }
  pMVar1 = *var_op_ref;
  if ((pMVar1 == (MIR_op_t *)0x0) || (pMVar1->field_0x8 != '\x02')) {
    __assert_fail("*var_op_ref != ((void*)0) && (*var_op_ref)->mode == MIR_OP_VAR",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x15ca,"int var_plus_const(gen_ctx_t, ssa_edge_t, bb_t, MIR_op_t **, int64_t *)")
    ;
  }
  pcVar4 = MIR_reg_hard_reg_name
                     (gen_ctx->ctx,(pMVar1->u).reg - 0x21,(gen_ctx->curr_func_item->u).func);
  if (pcVar4 != (char *)0x0) {
    return 0;
  }
  pMVar5 = se->def->insn;
  *c = 0;
  iVar3 = *(int *)&pMVar5->field_0x18;
  if ((iVar3 == 0) && (*(char *)&pMVar5[1].insn_link.prev == '\x02')) {
    pMVar5 = pMVar5 + 1;
  }
  else {
    if (((iVar3 == 0x27) || (iVar3 == 0x22)) && (*(char *)&pMVar5[1].insn_link.prev == '\x02')) {
      iVar2 = get_int_const(gen_ctx,(MIR_op_t *)&pMVar5[1].ops[0].u.str,c);
      iVar3 = *(int *)&pMVar5->field_0x18;
      if (iVar2 != 0) {
        pMVar5 = pMVar5 + 1;
        if (iVar3 == 0x27) {
          *c = -*c;
        }
        goto LAB_0016973a;
      }
    }
    if (iVar3 != 0x22) {
      return 0;
    }
    if (*(char *)((long)&pMVar5[1].ops[0].u + 8) != '\x02') {
      return 0;
    }
    iVar3 = get_int_const(gen_ctx,(MIR_op_t *)(pMVar5 + 1),c);
    if (iVar3 == 0) {
      return 0;
    }
    pMVar5 = (MIR_insn_t)&pMVar5[1].ops[0].u;
  }
LAB_0016973a:
  if (((pMVar5->data != (void *)0x0) &&
      (bb_insn = *(bb_insn_t_conflict *)((long)pMVar5->data + 8), bb_insn->bb != from_bb)) &&
     (iVar3 = cycle_phi_p(bb_insn), iVar3 != 0)) {
    return 0;
  }
  *var_op_ref = (MIR_op_t *)pMVar5;
  return 1;
}

Assistant:

static int var_plus_const (gen_ctx_t gen_ctx, ssa_edge_t se, bb_t from_bb, MIR_op_t **var_op_ref,
                           int64_t *c) {
  if (se == NULL) return FALSE; /* e.g. for arg */
  gen_assert (*var_op_ref != NULL && (*var_op_ref)->mode == MIR_OP_VAR);
  MIR_reg_t reg = (*var_op_ref)->u.var - MAX_HARD_REG;
  if (MIR_reg_hard_reg_name (gen_ctx->ctx, reg, curr_func_item->u.func) != NULL) return FALSE;
  MIR_insn_t insn = se->def->insn;
  MIR_op_t *res_ref = NULL;
  *c = 0;
  if (insn->code == MIR_MOV && insn->ops[1].mode == MIR_OP_VAR) {
    res_ref = &insn->ops[1];
  } else if ((insn->code == MIR_ADD || insn->code == MIR_SUB) && insn->ops[1].mode == MIR_OP_VAR
             && get_int_const (gen_ctx, &insn->ops[2], c)) {
    res_ref = &insn->ops[1];
    if (insn->code == MIR_SUB) *c = -*c;
  } else if (insn->code == MIR_ADD && insn->ops[2].mode == MIR_OP_VAR
             && get_int_const (gen_ctx, &insn->ops[1], c)) {
    res_ref = &insn->ops[2];
  } else {
    return FALSE;
  }
  if ((se = res_ref->data) != NULL && se->def->bb != from_bb && cycle_phi_p (se->def)) return FALSE;
  *var_op_ref = res_ref;
  return TRUE;
}